

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O3

void __thiscall bsplib::Rdma::ActionBuf::~ActionBuf(ActionBuf *this)

{
  pointer puVar1;
  pointer pAVar2;
  
  puVar1 = (this->m_get_buffer_offset).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_get_buffer_offset).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_counts).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pAVar2 = (this->m_actions).
           super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pAVar2 != (pointer)0x0) {
    operator_delete(pAVar2,(long)(this->m_actions).
                                 super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar2);
    return;
  }
  return;
}

Assistant:

ActionBuf( int nprocs )
            : m_actions()
            , m_counts( nprocs )
            , m_get_buffer_offset( nprocs )
        {}